

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,uchar **mem)

{
  uchar *puVar1;
  int *piVar2;
  void *pvVar3;
  int *piVar4;
  void *pvVar5;
  int iVar6;
  Mat *pMVar7;
  int iVar8;
  size_t sVar9;
  size_t __n;
  
  clear(this);
  piVar2 = (int *)*mem;
  iVar6 = *piVar2;
  while( true ) {
    piVar4 = piVar2 + 1;
    *mem = (uchar *)piVar4;
    if (iVar6 == -0xe9) break;
    iVar8 = -(iVar6 + 0x5b04);
    if (-0x5b04 < iVar6) {
      iVar8 = iVar6;
    }
    if (iVar6 < -0x5b03) {
      iVar6 = *piVar4;
      sVar9 = (size_t)iVar6;
      *mem = (uchar *)(piVar2 + 2);
      pMVar7 = &this->params[iVar8].v;
      if (((this->params[iVar8].v.dims != 1) || (this->params[iVar8].v.w != iVar6)) ||
         (this->params[iVar8].v.elemsize != 4)) {
        piVar2 = this->params[iVar8].v.refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if ((*piVar2 == 0) && (pMVar7->data != (void *)0x0)) {
            free(*(void **)((long)pMVar7->data + -8));
          }
        }
        this->params[iVar8].v.elemsize = 0;
        this->params[iVar8].v.dims = 0;
        this->params[iVar8].v.w = 0;
        this->params[iVar8].v.h = 0;
        this->params[iVar8].v.c = 0;
        this->params[iVar8].v.cstep = 0;
        pMVar7->data = (void *)0x0;
        this->params[iVar8].v.refcount = (int *)0x0;
        this->params[iVar8].v.elemsize = 4;
        this->params[iVar8].v.dims = 1;
        this->params[iVar8].v.w = iVar6;
        this->params[iVar8].v.h = 1;
        this->params[iVar8].v.c = 1;
        this->params[iVar8].v.cstep = sVar9;
        if (iVar6 != 0) {
          pvVar3 = malloc(sVar9 * 4 + 0x1c);
          pvVar5 = (void *)((long)pvVar3 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar5 - 8) = pvVar3;
          pMVar7->data = pvVar5;
          piVar2 = (int *)((long)pvVar5 + sVar9 * 4);
          this->params[iVar8].v.refcount = piVar2;
          *piVar2 = 1;
        }
      }
      __n = sVar9 << 2;
      memcpy(pMVar7->data,*mem,__n);
    }
    else {
      this->params[iVar8].field_1.i = *piVar4;
      __n = 4;
    }
    puVar1 = *mem;
    piVar2 = (int *)(puVar1 + __n);
    *mem = (uchar *)piVar2;
    this->params[iVar8].loaded = 1;
    iVar6 = *(int *)(puVar1 + __n);
  }
  return 0;
}

Assistant:

int ParamDict::load_param(const unsigned char*& mem)
{
    clear();

    int id = *(int*)(mem);
    mem += 4;

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = *(int*)(mem);
            mem += 4;

            params[id].v.create(len);

            memcpy(params[id].v.data, mem, len * 4);
            mem += len * 4;
        }
        else
        {
            params[id].f = *(float*)(mem);
            mem += 4;
        }

        params[id].loaded = 1;

        id = *(int*)(mem);
        mem += 4;
    }

    return 0;
}